

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cpp
# Opt level: O3

bool __thiscall ast::Value::evaluate(Value *this)

{
  uint uVar1;
  uint uVar2;
  string local_38;
  
  uVar1 = (this->super_Expression).value;
  uVar2 = -uVar1;
  if (0 < (int)uVar1) {
    uVar2 = uVar1;
  }
  if (0xffff < uVar2) {
    string_printf_abi_cxx11_
              (&local_38,"value = %d (0x%x) not encodable in a %d bit word",(ulong)uVar1,
               (ulong)uVar1,0x10);
    warning_report(&(this->super_Expression).location,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  return uVar2 < 0x10000;
}

Assistant:

bool Value::evaluate()
{
	if ((abs(value ) & ~mask(16, 0)) != 0) {
		warning_report(&location, string_printf("value = %d (0x%x) not encodable in a %d bit word",
				value, value, 16));
		return false;
	}
	return true;
}